

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleTargetMode(cmSetPropertyCommand *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *name;
  bool bVar2;
  cmTarget *target;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  ostringstream e;
  string local_1c0;
  string local_1a0 [11];
  
  p_Var3 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Names)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
LAB_0027a418:
      return (_Rb_tree_header *)p_Var3 == p_Var1;
    }
    name = p_Var3 + 1;
    bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,(string *)name);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,"can not be used on an ALIAS target.",
                 (allocator<char> *)&local_1c0);
      cmCommand::SetError(&this->super_cmCommand,local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      goto LAB_0027a418;
    }
    target = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,(string *)name,false);
    if (target == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar4 = std::operator<<((ostream *)local_1a0,"could not find TARGET ");
      poVar4 = std::operator<<(poVar4,(string *)name);
      std::operator<<(poVar4,".  Perhaps it has not yet been created.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      goto LAB_0027a418;
    }
    HandleTarget(this,target);
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool cmSetPropertyCommand::HandleTargetMode()
{
  for (std::string const& name : this->Names) {
    if (this->Makefile->IsAlias(name)) {
      this->SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = this->Makefile->FindTargetToUse(name)) {
      // Handle the current target.
      if (!this->HandleTarget(target)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "could not find TARGET " << name
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}